

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall google::protobuf::DynamicMessage::CrossLinkPrototypes(DynamicMessage *this)

{
  DynamicMessageFactory *this_00;
  Descriptor *this_01;
  bool bVar1;
  int iVar2;
  CppType CVar3;
  LogMessage *pLVar4;
  FieldDescriptor *this_02;
  FieldOptions *this_03;
  undefined8 *puVar5;
  Descriptor *type;
  Message *pMVar6;
  void *field_ptr;
  FieldDescriptor *field;
  int i;
  Descriptor *descriptor;
  DynamicMessageFactory *factory;
  LogMessage local_28;
  Voidify local_11;
  DynamicMessage *local_10;
  DynamicMessage *this_local;
  
  local_10 = this;
  bVar1 = is_prototype(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = this->type_info_->factory;
    this_01 = (this->type_info_->class_data).descriptor;
    for (field._4_4_ = 0; iVar2 = Descriptor::field_count(this_01), field._4_4_ < iVar2;
        field._4_4_ = field._4_4_ + 1) {
      this_02 = Descriptor::field(this_01,field._4_4_);
      CVar3 = FieldDescriptor::cpp_type(this_02);
      if (CVar3 == CPPTYPE_MESSAGE) {
        this_03 = FieldDescriptor::options(this_02);
        bVar1 = FieldOptions::weak(this_03);
        if (((!bVar1) && (bVar1 = anon_unknown_0::InRealOneof(this_02), !bVar1)) &&
           (bVar1 = FieldDescriptor::is_repeated(this_02), !bVar1)) {
          puVar5 = (undefined8 *)MutableRaw<void>(this,field._4_4_);
          type = FieldDescriptor::message_type(this_02);
          pMVar6 = DynamicMessageFactory::GetPrototypeNoLock(this_00,type);
          *puVar5 = pMVar6;
        }
      }
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/dynamic_message.cc"
             ,0x2d8,"is_prototype()");
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

void DynamicMessage::CrossLinkPrototypes() {
  // This should only be called on the prototype message.
  ABSL_CHECK(is_prototype());

  DynamicMessageFactory* factory = type_info_->factory;
  const Descriptor* descriptor = type_info_->class_data.descriptor;

  // Cross-link default messages.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !field->options().weak() && !InRealOneof(field) &&
        !field->is_repeated()) {
      void* field_ptr = MutableRaw(i);
      // For fields with message types, we need to cross-link with the
      // prototype for the field's type.
      // For singular fields, the field is just a pointer which should
      // point to the prototype.
      *reinterpret_cast<const Message**>(field_ptr) =
          factory->GetPrototypeNoLock(field->message_type());
    }
  }
}